

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O2

bool IsMeshInVerboseFormat(aiMesh *mesh)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  aiFace *paVar4;
  uint i;
  ulong uVar5;
  uint j;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> seen;
  allocator_type local_25;
  value_type_conflict1 local_24;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_20;
  
  local_24 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_20,
             (ulong)mesh->mNumVertices,&local_24,&local_25);
  for (uVar5 = 0; uVar1 = mesh->mNumFaces, uVar5 < uVar1; uVar5 = uVar5 + 1) {
    paVar4 = mesh->mFaces;
    uVar6 = 0;
    while (uVar6 < paVar4[uVar5].mNumIndices) {
      uVar2 = paVar4[uVar5].mIndices[uVar6];
      uVar3 = local_20._M_impl.super__Vector_impl_data._M_start[uVar2];
      local_20._M_impl.super__Vector_impl_data._M_start[uVar2] = uVar3 + 1;
      uVar6 = uVar6 + 1;
      if (uVar3 + 1 == 2) goto LAB_003216c4;
    }
  }
LAB_003216c4:
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_20);
  return uVar1 <= uVar5;
}

Assistant:

bool IsMeshInVerboseFormat(const aiMesh* mesh) {
    // avoid slow vector<bool> specialization
    std::vector<unsigned int> seen(mesh->mNumVertices,0);
    for(unsigned int i = 0; i < mesh->mNumFaces; ++i) {
        const aiFace& f = mesh->mFaces[i];
        for(unsigned int j = 0; j < f.mNumIndices; ++j) {
            if(++seen[f.mIndices[j]] == 2) {
                // found a duplicate index
                return false;
            }
        }
    }

    return true;
}